

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonSetFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  int iVar2;
  uchar *puVar3;
  JsonNode *pJVar4;
  char *zFuncName;
  ulong uVar5;
  int bApnd;
  JsonParse x;
  
  if (0 < argc) {
    pvVar1 = ctx->pFunc->pUserData;
    if ((argc & 1U) == 0) {
      zFuncName = "insert";
      if (pvVar1 != (void *)0x0) {
        zFuncName = "set";
      }
      jsonWrongNumArgs(ctx,zFuncName);
      return;
    }
    puVar3 = sqlite3_value_text(*argv);
    iVar2 = jsonParse(&x,ctx,(char *)puVar3);
    if (iVar2 == 0) {
      for (uVar5 = 1; uVar5 < (uint)argc; uVar5 = uVar5 + 2) {
        puVar3 = sqlite3_value_text(argv[uVar5]);
        bApnd = 0;
        pJVar4 = jsonLookup(&x,(char *)puVar3,&bApnd,ctx);
        if (x.oom != '\0') {
          sqlite3_result_error_nomem(ctx);
          goto LAB_0018a9d6;
        }
        if (x.nErr != '\0') goto LAB_0018a9d6;
        if ((pJVar4 != (JsonNode *)0x0) && (bApnd != 0 || pvVar1 != (void *)0x0)) {
          pJVar4->jnFlags = pJVar4->jnFlags | 8;
          (pJVar4->u).iAppend = (int)uVar5 + 1;
        }
      }
      if (((x.aNode)->jnFlags & 8) == 0) {
        jsonReturnJson(x.aNode,ctx,argv);
      }
      else {
        sqlite3_result_value(ctx,argv[((x.aNode)->u).iAppend]);
      }
LAB_0018a9d6:
      jsonParseReset(&x);
    }
  }
  return;
}

Assistant:

static void jsonSetFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;
  int bApnd;
  int bIsSet = sqlite3_user_data(ctx)!=0;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, bIsSet ? "set" : "insert");
    return;
  }
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i+=2){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    bApnd = 0;
    pNode = jsonLookup(&x, zPath, &bApnd, ctx);
    if( x.oom ){
      sqlite3_result_error_nomem(ctx);
      goto jsonSetDone;
    }else if( x.nErr ){
      goto jsonSetDone;
    }else if( pNode && (bApnd || bIsSet) ){
      testcase( pNode->eU!=0 && pNode->eU!=1 );
      assert( pNode->eU!=3 && pNode->eU!=5 );
      VVA( pNode->eU = 4 );
      pNode->jnFlags |= (u8)JNODE_REPLACE;
      pNode->u.iReplace = i + 1;
    }
  }
  if( x.aNode[0].jnFlags & JNODE_REPLACE ){
    assert( x.aNode[0].eU==4 );
    sqlite3_result_value(ctx, argv[x.aNode[0].u.iReplace]);
  }else{
    jsonReturnJson(x.aNode, ctx, argv);
  }
jsonSetDone:
  jsonParseReset(&x);
}